

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  int *piVar39;
  uint _w;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [32];
  uint _h;
  int iVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  _func_int ***ppp_Var48;
  ulong uVar49;
  float *pfVar50;
  ulong uVar51;
  float *pfVar52;
  ulong uVar53;
  int iVar54;
  long lVar55;
  undefined4 *puVar56;
  float *pfVar57;
  int iVar58;
  float *pfVar59;
  undefined1 (*pauVar60) [32];
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  long lVar65;
  undefined1 (*pauVar66) [32];
  int iVar67;
  uint uVar68;
  undefined4 *puVar69;
  float *pfVar70;
  float *pfVar71;
  undefined1 (*pauVar72) [32];
  float *pfVar73;
  int i;
  int iVar74;
  int iVar75;
  ulong uVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 in_ZMM4 [64];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar127 [64];
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar144 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  int L;
  Mat bottom_tm;
  Mat bottom_im2col;
  float zeros [8];
  long local_1b8;
  uint local_178;
  undefined1 local_158 [64];
  size_t local_118;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [32];
  Allocator *local_88;
  int iStack_80;
  int iStack_7c;
  undefined1 auStack_78 [12];
  size_t local_68;
  undefined1 local_58 [32];
  undefined1 auVar118 [32];
  
  iVar75 = bottom_blob->w;
  iVar63 = bottom_blob->c;
  sVar12 = bottom_blob->elemsize;
  uVar64 = top_blob->w;
  iVar9 = top_blob->h;
  pvVar13 = _bias->data;
  _w = uVar64 * iVar9;
  local_e8 = CONCAT44(local_e8._4_4_,kernel_h);
  iVar41 = kernel_h * kernel_w;
  _h = iVar63 * iVar41;
  iVar10 = top_blob->c;
  uVar42 = (ulong)iVar10;
  local_68 = 0;
  local_a8._0_8_ = (Allocator *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_88 = (Allocator *)local_a8._0_8_;
  iStack_80 = local_a8._8_4_;
  iStack_7c = local_a8._12_4_;
  auStack_78 = local_a8._16_12_;
  Mat::create((Mat *)local_a8,_w,_h,sVar12,opt->workspace_allocator);
  if (0 < (long)iVar63) {
    pvVar14 = bottom_blob->data;
    sVar15 = bottom_blob->cstep;
    sVar16 = bottom_blob->elemsize;
    local_1b8 = 0;
    do {
      if (0 < (int)local_e8) {
        iVar67 = iVar9 * iVar41 * uVar64 * (int)local_1b8;
        iVar62 = 0;
        iVar44 = 0;
        do {
          local_c8 = (Allocator *)CONCAT44(local_c8._4_4_,iVar44);
          local_108 = CONCAT44(local_108._4_4_,iVar62);
          if (0 < kernel_w) {
            iVar45 = 0;
            iVar61 = iVar62;
            do {
              if (0 < iVar9) {
                iVar74 = 0;
                iVar54 = iVar61;
                do {
                  if (0 < (int)uVar64) {
                    uVar51 = 0;
                    iVar58 = iVar54;
                    do {
                      *(undefined4 *)
                       ((long)(_func_int ***)local_a8._0_8_ + uVar51 * 4 + (long)iVar67 * 4) =
                           *(undefined4 *)
                            ((long)pvVar14 + (long)iVar58 * 4 + sVar15 * sVar16 * local_1b8);
                      uVar51 = uVar51 + 1;
                      iVar58 = iVar58 + stride_w;
                    } while (uVar64 != uVar51);
                    iVar67 = iVar67 + (int)uVar51;
                  }
                  iVar74 = iVar74 + 1;
                  iVar54 = iVar54 + stride_h * iVar75;
                } while (iVar74 != iVar9);
              }
              iVar45 = iVar45 + 1;
              iVar61 = iVar61 + 1;
            } while (iVar45 != kernel_w);
          }
          iVar44 = iVar44 + 1;
          iVar62 = iVar62 + iVar75;
        } while (iVar44 != (int)local_e8);
      }
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != iVar63);
  }
  uVar64 = _w + 7;
  if (-1 < (int)_w) {
    uVar64 = _w;
  }
  local_118 = 0;
  local_158._0_8_ = (Allocator *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_158._24_4_ = 0;
  local_158._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_158._32_8_ = local_158._0_8_;
  local_158._40_4_ = local_158._8_4_;
  local_158._44_4_ = local_158._12_4_;
  Mat::create((Mat *)local_158,iVar41 * 8,iVar63,(((int)uVar64 >> 3) - (uVar64 & 0xfffffff8)) + _w,
              sVar12,opt->workspace_allocator);
  lVar47 = (long)(int)_w;
  if (0 < (int)_w >> 3) {
    lVar55 = 0;
    uVar51 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var48 = (_func_int ***)
                    ((long)(_func_int ***)local_158._0_8_ + local_118 * uVar51 * local_158._16_8_);
        pauVar43 = (undefined1 (*) [32])((long)(_func_int ***)local_a8._0_8_ + lVar55);
        uVar64 = _h;
        do {
          *(undefined1 (*) [32])ppp_Var48 = *pauVar43;
          ppp_Var48 = ppp_Var48 + 4;
          pauVar43 = (undefined1 (*) [32])(*pauVar43 + lVar47 * 4);
          uVar64 = uVar64 - 1;
        } while (uVar64 != 0);
      }
      uVar51 = uVar51 + 1;
      lVar55 = lVar55 + 0x20;
    } while (uVar51 != (uint)((int)_w >> 3));
  }
  if ((_w & 0xfffffff8) != _w) {
    lVar55 = (long)(int)(_w & 0xfffffff8);
    puVar56 = (undefined4 *)((long)(_func_int ***)local_a8._0_8_ + lVar55 * 4);
    do {
      if (0 < (int)_h) {
        uVar64 = (uint)lVar55;
        uVar46 = uVar64 + 7;
        if (-1 < (int)uVar64) {
          uVar46 = uVar64;
        }
        lVar65 = 0;
        puVar69 = puVar56;
        do {
          *(undefined4 *)
           ((long)(_func_int ***)local_158._0_8_ +
           lVar65 * 4 +
           (long)(int)(((int)uVar46 >> 3) + (uVar64 - (uVar46 & 0xfffffff8))) *
           local_118 * local_158._16_8_) = *puVar69;
          puVar69 = puVar69 + lVar47;
          lVar65 = lVar65 + 1;
        } while (_h != (uint)lVar65);
      }
      lVar55 = lVar55 + 1;
      puVar56 = puVar56 + 1;
    } while (lVar55 < lVar47);
  }
  uVar64 = iVar10 >> 3;
  uVar51 = uVar42 & 0xfffffffffffffff8;
  if (0 < (int)uVar64) {
    local_178 = _h & 0xfffffffc;
    uVar53 = 0;
    auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      sVar12 = top_blob->cstep;
      pvVar14 = top_blob->data;
      sVar15 = top_blob->elemsize;
      pauVar66 = (undefined1 (*) [32])(uVar53 * 8 * sVar12 * sVar15 + (long)pvVar14);
      pfVar70 = (float *)((uVar53 * 8 + 1) * sVar12 * sVar15 + (long)pvVar14);
      pfVar73 = (float *)((uVar53 * 8 + 2) * sVar12 * sVar15 + (long)pvVar14);
      pfVar71 = (float *)((uVar53 * 8 + 3) * sVar12 * sVar15 + (long)pvVar14);
      pauVar72 = (undefined1 (*) [32])((uVar53 * 8 + 4) * sVar12 * sVar15 + (long)pvVar14);
      pauVar43 = (undefined1 (*) [32])((uVar53 * 8 + 5) * sVar12 * sVar15 + (long)pvVar14);
      pauVar60 = (undefined1 (*) [32])((uVar53 * 8 + 6) * sVar12 * sVar15 + (long)pvVar14);
      pfVar57 = (float *)((uVar53 * 8 + 7) * sVar12 * sVar15 + (long)pvVar14);
      pfVar52 = (float *)(uVar53 * 0x20 + (long)pvVar13);
      pfVar50 = pfVar52;
      if (pvVar13 == (void *)0x0) {
        pfVar50 = (float *)local_58;
      }
      local_58 = auVar127._0_32_;
      if ((int)_w < 8) {
        uVar76 = 0;
      }
      else {
        if (pvVar13 == (void *)0x0) {
          pfVar52 = (float *)local_58;
        }
        uVar49 = 0;
        do {
          ppp_Var48 = (_func_int ***)
                      ((long)(_func_int ***)local_158._0_8_ +
                      (uVar49 >> 3) * local_118 * local_158._16_8_);
          pfVar59 = (float *)(kernel_tm->cstep * uVar53 * kernel_tm->elemsize +
                             (long)kernel_tm->data);
          fVar88 = *pfVar50;
          auVar127 = ZEXT3264(CONCAT428(fVar88,CONCAT424(fVar88,CONCAT420(fVar88,CONCAT416(fVar88,
                                                  CONCAT412(fVar88,CONCAT48(fVar88,CONCAT44(fVar88,
                                                  fVar88))))))));
          fVar88 = pfVar52[1];
          fVar96 = pfVar52[2];
          fVar105 = pfVar52[3];
          fVar79 = pfVar52[4];
          in_ZMM4 = ZEXT3264(CONCAT428(fVar79,CONCAT424(fVar79,CONCAT420(fVar79,CONCAT416(fVar79,
                                                  CONCAT412(fVar79,CONCAT48(fVar79,CONCAT44(fVar79,
                                                  fVar79))))))));
          fVar79 = pfVar52[5];
          auVar119 = ZEXT3264(CONCAT428(fVar79,CONCAT424(fVar79,CONCAT420(fVar79,CONCAT416(fVar79,
                                                  CONCAT412(fVar79,CONCAT48(fVar79,CONCAT44(fVar79,
                                                  fVar79))))))));
          fVar79 = pfVar52[6];
          auVar123 = ZEXT3264(CONCAT428(fVar79,CONCAT424(fVar79,CONCAT420(fVar79,CONCAT416(fVar79,
                                                  CONCAT412(fVar79,CONCAT48(fVar79,CONCAT44(fVar79,
                                                  fVar79))))))));
          fVar79 = pfVar52[7];
          uVar46 = 0;
          fVar89 = fVar88;
          fVar90 = fVar88;
          fVar91 = fVar88;
          fVar92 = fVar88;
          fVar93 = fVar88;
          fVar94 = fVar88;
          fVar95 = fVar88;
          fVar98 = fVar96;
          fVar99 = fVar96;
          fVar100 = fVar96;
          fVar101 = fVar96;
          fVar102 = fVar96;
          fVar103 = fVar96;
          fVar104 = fVar96;
          fVar106 = fVar105;
          fVar107 = fVar105;
          fVar108 = fVar105;
          fVar109 = fVar105;
          fVar110 = fVar105;
          fVar111 = fVar105;
          fVar112 = fVar105;
          fVar83 = fVar79;
          fVar129 = fVar79;
          fVar131 = fVar79;
          fVar133 = fVar79;
          fVar135 = fVar79;
          fVar137 = fVar79;
          fVar139 = fVar79;
          if (3 < (int)_h) {
            iVar75 = 3;
            do {
              fVar1 = *pfVar59;
              fVar140 = pfVar59[1];
              fVar142 = pfVar59[2];
              fVar143 = pfVar59[3];
              fVar18 = *(float *)ppp_Var48;
              fVar19 = *(float *)((long)ppp_Var48 + 4);
              fVar20 = *(float *)(ppp_Var48 + 1);
              fVar21 = *(float *)((long)(ppp_Var48 + 1) + 4);
              fVar22 = *(float *)(ppp_Var48 + 2);
              fVar23 = *(float *)((long)(ppp_Var48 + 2) + 4);
              fVar24 = *(float *)(ppp_Var48 + 3);
              fVar25 = *(float *)(ppp_Var48 + 4);
              fVar26 = *(float *)((long)(ppp_Var48 + 4) + 4);
              fVar27 = *(float *)(ppp_Var48 + 5);
              fVar28 = *(float *)((long)(ppp_Var48 + 5) + 4);
              fVar29 = *(float *)(ppp_Var48 + 6);
              fVar30 = *(float *)((long)(ppp_Var48 + 6) + 4);
              fVar31 = *(float *)(ppp_Var48 + 7);
              fVar17 = auVar127._28_4_;
              fVar124 = pfVar59[4];
              fVar128 = pfVar59[5];
              fVar130 = pfVar59[6];
              fVar132 = pfVar59[7];
              fVar77 = fVar18 * fVar128 + auVar119._0_4_;
              fVar81 = fVar19 * fVar128 + auVar119._4_4_;
              fStack_e0 = fVar20 * fVar128 + auVar119._8_4_;
              fStack_dc = fVar21 * fVar128 + auVar119._12_4_;
              fStack_d8 = fVar22 * fVar128 + auVar119._16_4_;
              fStack_d4 = fVar23 * fVar128 + auVar119._20_4_;
              fStack_d0 = fVar24 * fVar128 + auVar119._24_4_;
              fStack_cc = fVar124 + auVar119._28_4_;
              local_e8 = CONCAT44(fVar81,fVar77);
              fVar78 = fVar130 * fVar18 + auVar123._0_4_;
              fVar82 = fVar130 * fVar19 + auVar123._4_4_;
              fStack_c0 = fVar130 * fVar20 + auVar123._8_4_;
              fStack_bc = fVar130 * fVar21 + auVar123._12_4_;
              fStack_b8 = fVar130 * fVar22 + auVar123._16_4_;
              fStack_b4 = fVar130 * fVar23 + auVar123._20_4_;
              fStack_b0 = fVar130 * fVar24 + auVar123._24_4_;
              fStack_ac = fVar124 + auVar123._28_4_;
              local_c8 = (Allocator *)CONCAT44(fVar82,fVar78);
              fVar79 = fVar79 + fVar132 * fVar18;
              fVar83 = fVar83 + fVar132 * fVar19;
              fStack_100 = fVar129 + fVar132 * fVar20;
              fStack_fc = fVar131 + fVar132 * fVar21;
              fStack_f8 = fVar133 + fVar132 * fVar22;
              fStack_f4 = fVar135 + fVar132 * fVar23;
              fStack_f0 = fVar137 + fVar132 * fVar24;
              fStack_ec = fVar139 + fVar124;
              local_108 = CONCAT44(fVar83,fVar79);
              fVar139 = pfVar59[8];
              fVar129 = pfVar59[9];
              fVar131 = pfVar59[10];
              fVar133 = pfVar59[0xb];
              fVar135 = pfVar59[0xc];
              fVar137 = pfVar59[0xd];
              fVar130 = pfVar59[0xe];
              fVar134 = pfVar59[0xf];
              fVar136 = pfVar59[0x10];
              fVar32 = *(float *)(ppp_Var48 + 8);
              fVar33 = *(float *)((long)(ppp_Var48 + 8) + 4);
              fVar34 = *(float *)(ppp_Var48 + 9);
              fVar35 = *(float *)((long)(ppp_Var48 + 9) + 4);
              fVar36 = *(float *)(ppp_Var48 + 10);
              fVar37 = *(float *)((long)(ppp_Var48 + 10) + 4);
              fVar38 = *(float *)(ppp_Var48 + 0xb);
              fVar138 = pfVar59[0x11];
              fVar2 = pfVar59[0x12];
              fVar3 = pfVar59[0x13];
              fVar4 = pfVar59[0x14];
              fVar84 = fVar104 + fVar128 + fVar3;
              fVar5 = pfVar59[0x15];
              fVar6 = pfVar59[0x16];
              fVar7 = pfVar59[0x17];
              auVar86 = *(undefined1 (*) [32])(ppp_Var48 + 0xc);
              fVar8 = pfVar59[0x18];
              fVar113 = auVar86._0_4_;
              fVar145 = auVar86._4_4_;
              fVar146 = auVar86._8_4_;
              fVar147 = auVar86._12_4_;
              fVar148 = auVar86._16_4_;
              fVar149 = auVar86._20_4_;
              fVar150 = auVar86._24_4_;
              auVar127 = ZEXT3264(CONCAT428(fVar1 + fVar17 +
                                            *(float *)((long)(ppp_Var48 + 3) + 4) + fVar136 + fVar8,
                                            CONCAT424(fVar24 * fVar1 + auVar127._24_4_ +
                                                      fVar31 * fVar139 + fVar38 * fVar136 +
                                                      fVar150 * fVar8,
                                                      CONCAT420(fVar23 * fVar1 + auVar127._20_4_ +
                                                                fVar30 * fVar139 + fVar37 * fVar136
                                                                + fVar149 * fVar8,
                                                                CONCAT416(fVar22 * fVar1 +
                                                                          auVar127._16_4_ +
                                                                          fVar29 * fVar139 +
                                                                          fVar36 * fVar136 +
                                                                          fVar148 * fVar8,
                                                                          CONCAT412(fVar21 * fVar1 +
                                                                                    auVar127._12_4_
                                                                                    + fVar28 * 
                                                  fVar139 + fVar35 * fVar136 + fVar147 * fVar8,
                                                  CONCAT48(fVar20 * fVar1 + auVar127._8_4_ +
                                                           fVar27 * fVar139 + fVar34 * fVar136 +
                                                           fVar146 * fVar8,
                                                           CONCAT44(fVar19 * fVar1 + auVar127._4_4_
                                                                    + fVar26 * fVar139 +
                                                                      fVar33 * fVar136 +
                                                                    fVar145 * fVar8,
                                                                    fVar18 * fVar1 + auVar127._0_4_
                                                                    + fVar25 * fVar139 +
                                                                      fVar32 * fVar136 +
                                                                    fVar113 * fVar8))))))));
              fVar139 = pfVar59[0x19];
              fVar88 = fVar18 * fVar140 + fVar88 + fVar138 * fVar32 + fVar25 * fVar129 +
                       fVar113 * fVar139;
              fVar89 = fVar19 * fVar140 + fVar89 + fVar138 * fVar33 + fVar26 * fVar129 +
                       fVar145 * fVar139;
              fVar90 = fVar20 * fVar140 + fVar90 + fVar138 * fVar34 + fVar27 * fVar129 +
                       fVar146 * fVar139;
              fVar91 = fVar21 * fVar140 + fVar91 + fVar138 * fVar35 + fVar28 * fVar129 +
                       fVar147 * fVar139;
              fVar92 = fVar22 * fVar140 + fVar92 + fVar138 * fVar36 + fVar29 * fVar129 +
                       fVar148 * fVar139;
              fVar93 = fVar23 * fVar140 + fVar93 + fVar138 * fVar37 + fVar30 * fVar129 +
                       fVar149 * fVar139;
              fVar94 = fVar24 * fVar140 + fVar94 + fVar138 * fVar38 + fVar31 * fVar129 +
                       fVar150 * fVar139;
              fVar95 = fVar17 + fVar95 + fVar138 + fStack_ec + fVar139;
              fVar139 = pfVar59[0x1a];
              fVar96 = fVar18 * fVar142 + fVar96 + fVar131 * fVar25 + fVar32 * fVar2 +
                       fVar113 * fVar139;
              fVar98 = fVar19 * fVar142 + fVar98 + fVar131 * fVar26 + fVar33 * fVar2 +
                       fVar145 * fVar139;
              fVar99 = fVar20 * fVar142 + fVar99 + fVar131 * fVar27 + fVar34 * fVar2 +
                       fVar146 * fVar139;
              fVar100 = fVar21 * fVar142 + fVar100 + fVar131 * fVar28 + fVar35 * fVar2 +
                        fVar147 * fVar139;
              fVar101 = fVar22 * fVar142 + fVar101 + fVar131 * fVar29 + fVar36 * fVar2 +
                        fVar148 * fVar139;
              fVar102 = fVar23 * fVar142 + fVar102 + fVar131 * fVar30 + fVar37 * fVar2 +
                        fVar149 * fVar139;
              fVar103 = fVar24 * fVar142 + fVar103 + fVar131 * fVar31 + fVar38 * fVar2 +
                        fVar150 * fVar139;
              fVar104 = fVar17 + fVar104 + fVar124 + fVar2 + fVar139;
              fVar139 = pfVar59[0x1b];
              fVar105 = fVar143 * fVar18 + fVar105 + fVar133 * fVar25 + fVar32 * fVar3 +
                        fVar113 * fVar139;
              fVar106 = fVar143 * fVar19 + fVar106 + fVar133 * fVar26 + fVar33 * fVar3 +
                        fVar145 * fVar139;
              fVar107 = fVar143 * fVar20 + fVar107 + fVar133 * fVar27 + fVar34 * fVar3 +
                        fVar146 * fVar139;
              fVar108 = fVar143 * fVar21 + fVar108 + fVar133 * fVar28 + fVar35 * fVar3 +
                        fVar147 * fVar139;
              fVar109 = fVar143 * fVar22 + fVar109 + fVar133 * fVar29 + fVar36 * fVar3 +
                        fVar148 * fVar139;
              fVar110 = fVar143 * fVar23 + fVar110 + fVar133 * fVar30 + fVar37 * fVar3 +
                        fVar149 * fVar139;
              fVar111 = fVar143 * fVar24 + fVar111 + fVar133 * fVar31 + fVar38 * fVar3 +
                        fVar150 * fVar139;
              fVar112 = fVar17 + fVar112 + fVar128 + fVar3 + fVar139;
              fVar139 = pfVar59[0x1c];
              in_ZMM4 = ZEXT3264(CONCAT428(fVar124 + in_ZMM4._28_4_ + fVar84 + fVar139,
                                           CONCAT424(fVar24 * fVar124 + in_ZMM4._24_4_ +
                                                     fVar31 * fVar135 + fVar38 * fVar4 +
                                                     fVar150 * fVar139,
                                                     CONCAT420(fVar23 * fVar124 + in_ZMM4._20_4_ +
                                                               fVar30 * fVar135 + fVar37 * fVar4 +
                                                               fVar149 * fVar139,
                                                               CONCAT416(fVar22 * fVar124 +
                                                                         in_ZMM4._16_4_ +
                                                                         fVar29 * fVar135 +
                                                                         fVar36 * fVar4 +
                                                                         fVar148 * fVar139,
                                                                         CONCAT412(fVar21 * fVar124
                                                                                   + in_ZMM4._12_4_
                                                                                   + fVar28 * 
                                                  fVar135 + fVar35 * fVar4 + fVar147 * fVar139,
                                                  CONCAT48(fVar20 * fVar124 + in_ZMM4._8_4_ +
                                                           fVar27 * fVar135 + fVar34 * fVar4 +
                                                           fVar146 * fVar139,
                                                           CONCAT44(fVar19 * fVar124 + in_ZMM4._4_4_
                                                                    + fVar26 * fVar135 +
                                                                      fVar33 * fVar4 +
                                                                    fVar145 * fVar139,
                                                                    fVar18 * fVar124 + in_ZMM4._0_4_
                                                                    + fVar25 * fVar135 +
                                                                      fVar32 * fVar4 +
                                                                    fVar113 * fVar139))))))));
              fVar139 = pfVar59[0x1d];
              auVar119 = ZEXT3264(CONCAT428(fVar132 + fVar5 + fStack_cc + fVar139,
                                            CONCAT424(fVar31 * fVar137 + fVar38 * fVar5 + fStack_d0
                                                      + fVar150 * fVar139,
                                                      CONCAT420(fVar30 * fVar137 + fVar37 * fVar5 +
                                                                fStack_d4 + fVar149 * fVar139,
                                                                CONCAT416(fVar29 * fVar137 +
                                                                          fVar36 * fVar5 + fStack_d8
                                                                          + fVar148 * fVar139,
                                                                          CONCAT412(fVar28 * fVar137
                                                                                    + fVar35 * fVar5
                                                                                    + fStack_dc +
                                                                                    fVar147 * 
                                                  fVar139,CONCAT48(fVar27 * fVar137 + fVar34 * fVar5
                                                                   + fStack_e0 + fVar146 * fVar139,
                                                                   CONCAT44(fVar26 * fVar137 +
                                                                            fVar33 * fVar5 + fVar81
                                                                            + fVar145 * fVar139,
                                                                            fVar25 * fVar137 +
                                                                            fVar32 * fVar5 + fVar77
                                                                            + fVar113 * fVar139)))))
                                                  )));
              fVar139 = pfVar59[0x1e];
              auVar123 = ZEXT3264(CONCAT428(fVar133 + fVar6 + fStack_ac + fVar139,
                                            CONCAT424(fVar130 * fVar31 + fVar38 * fVar6 + fStack_b0
                                                      + fVar150 * fVar139,
                                                      CONCAT420(fVar130 * fVar30 + fVar37 * fVar6 +
                                                                fStack_b4 + fVar149 * fVar139,
                                                                CONCAT416(fVar130 * fVar29 +
                                                                          fVar36 * fVar6 + fStack_b8
                                                                          + fVar148 * fVar139,
                                                                          CONCAT412(fVar130 * fVar28
                                                                                    + fVar35 * fVar6
                                                                                    + fStack_bc +
                                                                                    fVar147 * 
                                                  fVar139,CONCAT48(fVar130 * fVar27 + fVar34 * fVar6
                                                                   + fStack_c0 + fVar146 * fVar139,
                                                                   CONCAT44(fVar130 * fVar26 +
                                                                            fVar33 * fVar6 + fVar82
                                                                            + fVar145 * fVar139,
                                                                            fVar130 * fVar25 +
                                                                            fVar32 * fVar6 + fVar78
                                                                            + fVar113 * fVar139)))))
                                                  )));
              fVar139 = pfVar59[0x1f];
              fVar79 = fVar25 * fVar134 + fVar32 * fVar7 + fVar79 + fVar113 * fVar139;
              fVar83 = fVar26 * fVar134 + fVar33 * fVar7 + fVar83 + fVar145 * fVar139;
              fVar129 = fVar27 * fVar134 + fVar34 * fVar7 + fStack_100 + fVar146 * fVar139;
              fVar131 = fVar28 * fVar134 + fVar35 * fVar7 + fStack_fc + fVar147 * fVar139;
              fVar133 = fVar29 * fVar134 + fVar36 * fVar7 + fStack_f8 + fVar148 * fVar139;
              fVar135 = fVar30 * fVar134 + fVar37 * fVar7 + fStack_f4 + fVar149 * fVar139;
              fVar137 = fVar31 * fVar134 + fVar38 * fVar7 + fStack_f0 + fVar150 * fVar139;
              fVar139 = fVar134 + fVar7 + fStack_ec + fVar139;
              pfVar59 = pfVar59 + 0x20;
              ppp_Var48 = ppp_Var48 + 0x10;
              iVar75 = iVar75 + 4;
              uVar46 = local_178;
            } while (iVar75 < (int)_h);
          }
          auVar121 = auVar123._0_32_;
          auVar116 = auVar119._0_32_;
          auVar86 = auVar127._0_32_;
          iVar75 = _h - uVar46;
          if (iVar75 != 0 && (int)uVar46 <= (int)_h) {
            lVar55 = 0;
            do {
              fVar1 = *(float *)((long)pfVar59 + lVar55);
              auVar86 = *(undefined1 (*) [32])((long)ppp_Var48 + lVar55);
              fVar140 = auVar86._0_4_;
              fVar142 = auVar86._4_4_;
              fVar143 = auVar86._8_4_;
              fVar124 = auVar86._12_4_;
              fVar128 = auVar86._16_4_;
              fVar130 = auVar86._20_4_;
              fVar132 = auVar86._24_4_;
              auVar86._0_4_ = fVar140 * fVar1 + auVar127._0_4_;
              auVar86._4_4_ = fVar142 * fVar1 + auVar127._4_4_;
              auVar86._8_4_ = fVar143 * fVar1 + auVar127._8_4_;
              auVar86._12_4_ = fVar124 * fVar1 + auVar127._12_4_;
              auVar86._16_4_ = fVar128 * fVar1 + auVar127._16_4_;
              auVar86._20_4_ = fVar130 * fVar1 + auVar127._20_4_;
              auVar86._24_4_ = fVar132 * fVar1 + auVar127._24_4_;
              auVar86._28_4_ = fVar1 + auVar127._28_4_;
              auVar127 = ZEXT3264(auVar86);
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 4);
              fVar88 = fVar140 * fVar1 + fVar88;
              fVar89 = fVar142 * fVar1 + fVar89;
              fVar90 = fVar143 * fVar1 + fVar90;
              fVar91 = fVar124 * fVar1 + fVar91;
              fVar92 = fVar128 * fVar1 + fVar92;
              fVar93 = fVar130 * fVar1 + fVar93;
              fVar94 = fVar132 * fVar1 + fVar94;
              fVar95 = fVar1 + fVar95;
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 8);
              fVar96 = fVar140 * fVar1 + fVar96;
              fVar98 = fVar142 * fVar1 + fVar98;
              fVar99 = fVar143 * fVar1 + fVar99;
              fVar100 = fVar124 * fVar1 + fVar100;
              fVar101 = fVar128 * fVar1 + fVar101;
              fVar102 = fVar130 * fVar1 + fVar102;
              fVar103 = fVar132 * fVar1 + fVar103;
              fVar104 = fVar1 + fVar104;
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 0xc);
              fVar105 = fVar140 * fVar1 + fVar105;
              fVar106 = fVar142 * fVar1 + fVar106;
              fVar107 = fVar143 * fVar1 + fVar107;
              fVar108 = fVar124 * fVar1 + fVar108;
              fVar109 = fVar128 * fVar1 + fVar109;
              fVar110 = fVar130 * fVar1 + fVar110;
              fVar111 = fVar132 * fVar1 + fVar111;
              fVar112 = fVar1 + fVar112;
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 0x10);
              in_ZMM4 = ZEXT3264(CONCAT428(fVar1 + in_ZMM4._28_4_,
                                           CONCAT424(fVar132 * fVar1 + in_ZMM4._24_4_,
                                                     CONCAT420(fVar130 * fVar1 + in_ZMM4._20_4_,
                                                               CONCAT416(fVar128 * fVar1 +
                                                                         in_ZMM4._16_4_,
                                                                         CONCAT412(fVar124 * fVar1 +
                                                                                   in_ZMM4._12_4_,
                                                                                   CONCAT48(fVar143 
                                                  * fVar1 + in_ZMM4._8_4_,
                                                  CONCAT44(fVar142 * fVar1 + in_ZMM4._4_4_,
                                                           fVar140 * fVar1 + in_ZMM4._0_4_))))))));
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 0x14);
              auVar116._0_4_ = fVar140 * fVar1 + auVar119._0_4_;
              auVar116._4_4_ = fVar142 * fVar1 + auVar119._4_4_;
              auVar116._8_4_ = fVar143 * fVar1 + auVar119._8_4_;
              auVar116._12_4_ = fVar124 * fVar1 + auVar119._12_4_;
              auVar116._16_4_ = fVar128 * fVar1 + auVar119._16_4_;
              auVar116._20_4_ = fVar130 * fVar1 + auVar119._20_4_;
              auVar116._24_4_ = fVar132 * fVar1 + auVar119._24_4_;
              auVar116._28_4_ = fVar1 + auVar119._28_4_;
              auVar119 = ZEXT3264(auVar116);
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 0x18);
              auVar121._0_4_ = fVar140 * fVar1 + auVar123._0_4_;
              auVar121._4_4_ = fVar142 * fVar1 + auVar123._4_4_;
              auVar121._8_4_ = fVar143 * fVar1 + auVar123._8_4_;
              auVar121._12_4_ = fVar124 * fVar1 + auVar123._12_4_;
              auVar121._16_4_ = fVar128 * fVar1 + auVar123._16_4_;
              auVar121._20_4_ = fVar130 * fVar1 + auVar123._20_4_;
              auVar121._24_4_ = fVar132 * fVar1 + auVar123._24_4_;
              auVar121._28_4_ = fVar1 + auVar123._28_4_;
              auVar123 = ZEXT3264(auVar121);
              fVar1 = *(float *)((long)pfVar59 + lVar55 + 0x1c);
              fVar79 = fVar79 + fVar140 * fVar1;
              fVar83 = fVar83 + fVar142 * fVar1;
              fVar129 = fVar129 + fVar143 * fVar1;
              fVar131 = fVar131 + fVar124 * fVar1;
              fVar133 = fVar133 + fVar128 * fVar1;
              fVar135 = fVar135 + fVar130 * fVar1;
              fVar137 = fVar137 + fVar132 * fVar1;
              fVar139 = fVar139 + fVar1;
              lVar55 = lVar55 + 0x20;
              iVar75 = iVar75 + -1;
            } while (iVar75 != 0);
          }
          *pauVar66 = auVar86;
          *pfVar70 = fVar88;
          pfVar70[1] = fVar89;
          pfVar70[2] = fVar90;
          pfVar70[3] = fVar91;
          pfVar70[4] = fVar92;
          pfVar70[5] = fVar93;
          pfVar70[6] = fVar94;
          pfVar70[7] = fVar95;
          *pfVar73 = fVar96;
          pfVar73[1] = fVar98;
          pfVar73[2] = fVar99;
          pfVar73[3] = fVar100;
          pfVar73[4] = fVar101;
          pfVar73[5] = fVar102;
          pfVar73[6] = fVar103;
          pfVar73[7] = fVar104;
          *pfVar71 = fVar105;
          pfVar71[1] = fVar106;
          pfVar71[2] = fVar107;
          pfVar71[3] = fVar108;
          pfVar71[4] = fVar109;
          pfVar71[5] = fVar110;
          pfVar71[6] = fVar111;
          pfVar71[7] = fVar112;
          *pauVar72 = in_ZMM4._0_32_;
          *pauVar43 = auVar116;
          *pauVar60 = auVar121;
          *pfVar57 = fVar79;
          pfVar57[1] = fVar83;
          pfVar57[2] = fVar129;
          pfVar57[3] = fVar131;
          pfVar57[4] = fVar133;
          pfVar57[5] = fVar135;
          pfVar57[6] = fVar137;
          pfVar57[7] = fVar139;
          pauVar66 = pauVar66 + 1;
          pfVar70 = pfVar70 + 8;
          pfVar73 = pfVar73 + 8;
          pfVar71 = pfVar71 + 8;
          pauVar72 = pauVar72 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar60 = pauVar60 + 1;
          pfVar57 = pfVar57 + 8;
          uVar76 = uVar49 + 8;
          lVar55 = uVar49 + 0xf;
          uVar49 = uVar76;
        } while (lVar55 < lVar47);
        auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      if ((int)uVar76 < (int)_w) {
        local_108 = CONCAT44(local_108._4_4_,local_158._40_4_);
        local_c8 = (Allocator *)local_158._0_8_;
        local_e8 = local_118 * local_158._16_8_;
        pfVar52 = (float *)(kernel_tm->cstep * uVar53 * kernel_tm->elemsize + (long)kernel_tm->data)
        ;
        do {
          ppp_Var48 = (_func_int ***)
                      ((long)(_func_int ***)local_158._0_8_ +
                      local_e8 * (ulong)(((uint)uVar76 & 7) + ((uint)(uVar76 >> 3) & 0x1fffffff)));
          pfVar59 = pfVar52;
          if ((int)_h < 4) {
            fVar92 = 0.0;
            fVar93 = 0.0;
            fVar94 = 0.0;
            fVar95 = 0.0;
            fVar98 = 0.0;
            fVar99 = 0.0;
            fVar100 = 0.0;
            fVar101 = 0.0;
            in_ZMM4 = ZEXT864(0);
            fVar102 = 0.0;
            fVar103 = 0.0;
            fVar104 = 0.0;
            fVar106 = 0.0;
            fVar107 = 0.0;
            fVar108 = 0.0;
            fVar109 = 0.0;
            fVar110 = 0.0;
            fVar88 = 0.0;
            fVar96 = 0.0;
            fVar105 = 0.0;
            fVar79 = 0.0;
            fVar139 = 0.0;
            fVar89 = 0.0;
            fVar90 = 0.0;
            fVar91 = 0.0;
            uVar46 = 0;
          }
          else {
            fVar88 = 0.0;
            fVar96 = 0.0;
            fVar105 = 0.0;
            fVar79 = 0.0;
            fVar139 = 0.0;
            fVar89 = 0.0;
            fVar90 = 0.0;
            fVar91 = 0.0;
            iVar75 = 3;
            fVar102 = 0.0;
            fVar103 = 0.0;
            fVar104 = 0.0;
            fVar106 = 0.0;
            fVar107 = 0.0;
            fVar108 = 0.0;
            fVar109 = 0.0;
            fVar110 = 0.0;
            in_ZMM4 = ZEXT864(0);
            fVar92 = 0.0;
            fVar93 = 0.0;
            fVar94 = 0.0;
            fVar95 = 0.0;
            fVar98 = 0.0;
            fVar99 = 0.0;
            fVar100 = 0.0;
            fVar101 = 0.0;
            do {
              fVar111 = *(float *)ppp_Var48;
              fVar112 = *(float *)((long)ppp_Var48 + 4);
              fVar83 = *(float *)(ppp_Var48 + 1);
              fVar129 = *(float *)((long)(ppp_Var48 + 1) + 4);
              fVar92 = fVar111 * *pfVar59 + fVar92;
              fVar93 = fVar111 * pfVar59[1] + fVar93;
              fVar94 = fVar111 * pfVar59[2] + fVar94;
              fVar95 = fVar111 * pfVar59[3] + fVar95;
              fVar98 = fVar111 * pfVar59[4] + fVar98;
              fVar99 = fVar111 * pfVar59[5] + fVar99;
              fVar100 = fVar111 * pfVar59[6] + fVar100;
              fVar101 = fVar111 + fVar101;
              in_ZMM4 = ZEXT3264(CONCAT428(fVar112 + in_ZMM4._28_4_,
                                           CONCAT424(fVar112 * pfVar59[0xe] + in_ZMM4._24_4_,
                                                     CONCAT420(fVar112 * pfVar59[0xd] +
                                                               in_ZMM4._20_4_,
                                                               CONCAT416(fVar112 * pfVar59[0xc] +
                                                                         in_ZMM4._16_4_,
                                                                         CONCAT412(fVar112 * pfVar59
                                                  [0xb] + in_ZMM4._12_4_,
                                                  CONCAT48(fVar112 * pfVar59[10] + in_ZMM4._8_4_,
                                                           CONCAT44(fVar112 * pfVar59[9] +
                                                                    in_ZMM4._4_4_,
                                                                    fVar112 * pfVar59[8] +
                                                                    in_ZMM4._0_4_))))))));
              fVar102 = fVar83 * pfVar59[0x10] + fVar102;
              fVar103 = fVar83 * pfVar59[0x11] + fVar103;
              fVar104 = fVar83 * pfVar59[0x12] + fVar104;
              fVar106 = fVar83 * pfVar59[0x13] + fVar106;
              fVar107 = fVar83 * pfVar59[0x14] + fVar107;
              fVar108 = fVar83 * pfVar59[0x15] + fVar108;
              fVar109 = fVar83 * pfVar59[0x16] + fVar109;
              fVar110 = fVar111 + fVar110;
              fVar88 = fVar129 * pfVar59[0x18] + fVar88;
              fVar96 = fVar129 * pfVar59[0x19] + fVar96;
              fVar105 = fVar129 * pfVar59[0x1a] + fVar105;
              fVar79 = fVar129 * pfVar59[0x1b] + fVar79;
              fVar139 = fVar129 * pfVar59[0x1c] + fVar139;
              fVar89 = fVar129 * pfVar59[0x1d] + fVar89;
              fVar90 = fVar129 * pfVar59[0x1e] + fVar90;
              fVar91 = fVar111 + fVar91;
              pfVar59 = pfVar59 + 0x20;
              ppp_Var48 = ppp_Var48 + 2;
              iVar75 = iVar75 + 4;
              uVar46 = local_178;
            } while (iVar75 < (int)_h);
          }
          auVar87._0_4_ = fVar92 + in_ZMM4._0_4_ + fVar102 + *pfVar50 + fVar88;
          auVar87._4_4_ = fVar93 + in_ZMM4._4_4_ + fVar103 + pfVar50[1] + fVar96;
          auVar87._8_4_ = fVar94 + in_ZMM4._8_4_ + fVar104 + pfVar50[2] + fVar105;
          auVar87._12_4_ = fVar95 + in_ZMM4._12_4_ + fVar106 + pfVar50[3] + fVar79;
          auVar87._16_4_ = fVar98 + in_ZMM4._16_4_ + fVar107 + pfVar50[4] + fVar139;
          auVar87._20_4_ = fVar99 + in_ZMM4._20_4_ + fVar108 + pfVar50[5] + fVar89;
          auVar87._24_4_ = fVar100 + in_ZMM4._24_4_ + fVar109 + pfVar50[6] + fVar90;
          auVar87._28_4_ = fVar101 + in_ZMM4._28_4_ + fVar110 + pfVar50[7] + fVar91;
          if ((int)uVar46 < (int)_h) {
            lVar55 = 0;
            auVar86 = auVar87;
            do {
              fVar88 = *(float *)((long)ppp_Var48 + lVar55 * 4);
              auVar87._0_4_ = fVar88 * *pfVar59 + auVar86._0_4_;
              auVar87._4_4_ = fVar88 * pfVar59[1] + auVar86._4_4_;
              auVar87._8_4_ = fVar88 * pfVar59[2] + auVar86._8_4_;
              auVar87._12_4_ = fVar88 * pfVar59[3] + auVar86._12_4_;
              auVar87._16_4_ = fVar88 * pfVar59[4] + auVar86._16_4_;
              auVar87._20_4_ = fVar88 * pfVar59[5] + auVar86._20_4_;
              auVar87._24_4_ = fVar88 * pfVar59[6] + auVar86._24_4_;
              auVar87._28_4_ = fVar88 + auVar86._28_4_;
              pfVar59 = pfVar59 + 8;
              lVar55 = lVar55 + 1;
              auVar86 = auVar87;
            } while (_h - uVar46 != (int)lVar55);
          }
          *(int *)*pauVar66 = auVar87._0_4_;
          auVar85 = auVar87._0_16_;
          fVar88 = (float)vextractps_avx(auVar85,1);
          *pfVar70 = fVar88;
          fVar88 = (float)vextractps_avx(auVar85,2);
          *pfVar73 = fVar88;
          fVar88 = (float)vextractps_avx(auVar85,3);
          *pfVar71 = fVar88;
          auVar85 = auVar87._16_16_;
          *(int *)*pauVar72 = auVar87._16_4_;
          uVar11 = vextractps_avx(auVar85,1);
          *(undefined4 *)*pauVar43 = uVar11;
          uVar11 = vextractps_avx(auVar85,2);
          *(undefined4 *)*pauVar60 = uVar11;
          fVar88 = (float)vextractps_avx(auVar85,3);
          *pfVar57 = fVar88;
          pauVar66 = (undefined1 (*) [32])((long)*pauVar66 + 4);
          pfVar70 = pfVar70 + 1;
          pfVar73 = pfVar73 + 1;
          pfVar71 = pfVar71 + 1;
          pauVar72 = (undefined1 (*) [32])((long)*pauVar72 + 4);
          pauVar43 = (undefined1 (*) [32])((long)*pauVar43 + 4);
          pauVar60 = (undefined1 (*) [32])((long)*pauVar60 + 4);
          pfVar57 = pfVar57 + 1;
          uVar46 = (uint)uVar76 + 1;
          uVar76 = (ulong)uVar46;
        } while (uVar46 != _w);
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != uVar64);
  }
  auVar85 = in_ZMM4._0_16_;
  uVar46 = (uint)(uVar42 >> 2) & 1;
  if ((uVar42 >> 2 & 1) != 0) {
    sVar12 = top_blob->cstep;
    pvVar14 = top_blob->data;
    sVar15 = top_blob->elemsize;
    pfVar73 = (float *)(sVar12 * uVar51 * sVar15 + (long)pvVar14);
    pfVar57 = (float *)((uVar51 | 1) * sVar12 * sVar15 + (long)pvVar14);
    pfVar70 = (float *)((uVar51 | 2) * sVar12 * sVar15 + (long)pvVar14);
    pfVar52 = (float *)((long)pvVar13 + uVar51 * 4);
    pfVar71 = (float *)((uVar51 | 3) * sVar12 * sVar15 + (long)pvVar14);
    pfVar50 = pfVar52;
    if (pvVar13 == (void *)0x0) {
      pfVar50 = (float *)local_58;
    }
    uVar53 = 0;
    local_58._0_16_ = ZEXT816(0);
    if (7 < (int)_w) {
      if (pvVar13 == (void *)0x0) {
        pfVar52 = (float *)local_58;
      }
      uVar76 = 0;
      do {
        ppp_Var48 = (_func_int ***)
                    ((long)(_func_int ***)local_158._0_8_ +
                    (uVar76 >> 3) * local_118 * local_158._16_8_);
        pfVar59 = (float *)(kernel_tm->cstep * (long)(int)uVar64 * kernel_tm->elemsize +
                           (long)kernel_tm->data);
        fVar88 = *pfVar50;
        fVar96 = pfVar52[1];
        fVar105 = pfVar52[2];
        fVar79 = pfVar52[3];
        fVar139 = fVar88;
        fVar89 = fVar88;
        fVar90 = fVar88;
        fVar91 = fVar88;
        fVar92 = fVar88;
        fVar93 = fVar88;
        fVar94 = fVar88;
        fVar95 = fVar96;
        fVar98 = fVar96;
        fVar99 = fVar96;
        fVar100 = fVar96;
        fVar101 = fVar96;
        fVar102 = fVar96;
        fVar103 = fVar96;
        fVar104 = fVar105;
        fVar106 = fVar105;
        fVar107 = fVar105;
        fVar108 = fVar105;
        fVar109 = fVar105;
        fVar110 = fVar105;
        fVar111 = fVar105;
        fVar112 = fVar79;
        fVar83 = fVar79;
        fVar129 = fVar79;
        fVar131 = fVar79;
        fVar133 = fVar79;
        fVar135 = fVar79;
        fVar137 = fVar79;
        if ((int)_h < 4) {
          uVar40 = 0;
        }
        else {
          iVar75 = 3;
          do {
            fVar1 = *pfVar59;
            fVar140 = pfVar59[1];
            fVar142 = pfVar59[2];
            fVar143 = pfVar59[3];
            fVar22 = *(float *)ppp_Var48;
            fVar23 = *(float *)((long)ppp_Var48 + 4);
            fVar24 = *(float *)(ppp_Var48 + 1);
            fVar25 = *(float *)((long)(ppp_Var48 + 1) + 4);
            fVar26 = *(float *)(ppp_Var48 + 2);
            fVar27 = *(float *)((long)(ppp_Var48 + 2) + 4);
            fVar28 = *(float *)(ppp_Var48 + 3);
            fVar29 = *(float *)(ppp_Var48 + 4);
            fVar30 = *(float *)((long)(ppp_Var48 + 4) + 4);
            fVar31 = *(float *)(ppp_Var48 + 5);
            fVar32 = *(float *)((long)(ppp_Var48 + 5) + 4);
            fVar33 = *(float *)(ppp_Var48 + 6);
            fVar34 = *(float *)((long)(ppp_Var48 + 6) + 4);
            fVar35 = *(float *)(ppp_Var48 + 7);
            auVar86 = *(undefined1 (*) [32])(ppp_Var48 + 8);
            fVar36 = *(float *)(ppp_Var48 + 0xc);
            fVar37 = *(float *)((long)(ppp_Var48 + 0xc) + 4);
            fVar38 = *(float *)(ppp_Var48 + 0xd);
            fVar77 = *(float *)((long)(ppp_Var48 + 0xd) + 4);
            fVar78 = *(float *)(ppp_Var48 + 0xe);
            fVar81 = *(float *)((long)(ppp_Var48 + 0xe) + 4);
            fVar82 = *(float *)(ppp_Var48 + 0xf);
            fVar124 = pfVar59[4];
            fVar128 = pfVar59[5];
            fVar130 = pfVar59[6];
            fVar132 = pfVar59[7];
            fVar134 = pfVar59[8];
            fVar136 = pfVar59[9];
            fVar138 = pfVar59[10];
            fVar2 = pfVar59[0xb];
            fVar7 = auVar86._0_4_;
            fVar8 = auVar86._4_4_;
            fVar17 = auVar86._8_4_;
            fVar18 = auVar86._12_4_;
            fVar19 = auVar86._16_4_;
            fVar20 = auVar86._20_4_;
            fVar21 = auVar86._24_4_;
            fVar84 = fVar128 + fVar134 + fVar124;
            fVar113 = fVar130 + fVar84;
            fVar3 = pfVar59[0xc];
            fVar4 = pfVar59[0xd];
            fVar5 = pfVar59[0xe];
            fVar6 = pfVar59[0xf];
            fVar88 = fVar22 * fVar1 + fVar88 + fVar134 * fVar7 + fVar29 * fVar124 + fVar3 * fVar36;
            fVar139 = fVar23 * fVar1 + fVar139 + fVar134 * fVar8 + fVar30 * fVar124 + fVar3 * fVar37
            ;
            fVar89 = fVar24 * fVar1 + fVar89 + fVar134 * fVar17 + fVar31 * fVar124 + fVar3 * fVar38;
            fVar90 = fVar25 * fVar1 + fVar90 + fVar134 * fVar18 + fVar32 * fVar124 + fVar3 * fVar77;
            fVar91 = fVar26 * fVar1 + fVar91 + fVar134 * fVar19 + fVar33 * fVar124 + fVar3 * fVar78;
            fVar92 = fVar27 * fVar1 + fVar92 + fVar134 * fVar20 + fVar34 * fVar124 + fVar3 * fVar81;
            fVar93 = fVar28 * fVar1 + fVar93 + fVar134 * fVar21 + fVar35 * fVar124 + fVar3 * fVar82;
            fVar94 = fVar1 + fVar94 + fVar134 + fVar124 + fVar3;
            fVar96 = fVar22 * fVar140 + fVar96 + fVar29 * fVar128 + fVar136 * fVar7 + fVar4 * fVar36
            ;
            fVar95 = fVar23 * fVar140 + fVar95 + fVar30 * fVar128 + fVar136 * fVar8 + fVar4 * fVar37
            ;
            fVar98 = fVar24 * fVar140 + fVar98 + fVar31 * fVar128 + fVar136 * fVar17 +
                     fVar4 * fVar38;
            fVar99 = fVar25 * fVar140 + fVar99 + fVar32 * fVar128 + fVar136 * fVar18 +
                     fVar4 * fVar77;
            fVar100 = fVar26 * fVar140 + fVar100 + fVar33 * fVar128 + fVar136 * fVar19 +
                      fVar4 * fVar78;
            fVar101 = fVar27 * fVar140 + fVar101 + fVar34 * fVar128 + fVar136 * fVar20 +
                      fVar4 * fVar81;
            fVar102 = fVar28 * fVar140 + fVar102 + fVar35 * fVar128 + fVar136 * fVar21 +
                      fVar4 * fVar82;
            fVar103 = fVar1 + fVar103 + fVar84 + fVar3;
            fVar105 = fVar22 * fVar142 + fVar105 + fVar29 * fVar130 + fVar138 * fVar7 +
                      fVar5 * fVar36;
            fVar104 = fVar23 * fVar142 + fVar104 + fVar30 * fVar130 + fVar138 * fVar8 +
                      fVar5 * fVar37;
            fVar106 = fVar24 * fVar142 + fVar106 + fVar31 * fVar130 + fVar138 * fVar17 +
                      fVar5 * fVar38;
            fVar107 = fVar25 * fVar142 + fVar107 + fVar32 * fVar130 + fVar138 * fVar18 +
                      fVar5 * fVar77;
            fVar108 = fVar26 * fVar142 + fVar108 + fVar33 * fVar130 + fVar138 * fVar19 +
                      fVar5 * fVar78;
            fVar109 = fVar27 * fVar142 + fVar109 + fVar34 * fVar130 + fVar138 * fVar20 +
                      fVar5 * fVar81;
            fVar110 = fVar28 * fVar142 + fVar110 + fVar35 * fVar130 + fVar138 * fVar21 +
                      fVar5 * fVar82;
            fVar111 = fVar1 + fVar111 + fVar113 + fVar3;
            in_ZMM4 = ZEXT3264(CONCAT428(*(float *)((long)(ppp_Var48 + 0xf) + 4),
                                         CONCAT424(fVar6 * fVar82,
                                                   CONCAT420(fVar6 * fVar81,
                                                             CONCAT416(fVar6 * fVar78,
                                                                       CONCAT412(fVar6 * fVar77,
                                                                                 CONCAT48(fVar6 * 
                                                  fVar38,CONCAT44(fVar6 * fVar37,fVar6 * fVar36)))))
                                                  )));
            fVar79 = fVar143 * fVar22 + fVar79 + fVar132 * fVar29 + fVar2 * fVar7 + fVar6 * fVar36;
            fVar112 = fVar143 * fVar23 + fVar112 + fVar132 * fVar30 + fVar2 * fVar8 + fVar6 * fVar37
            ;
            fVar83 = fVar143 * fVar24 + fVar83 + fVar132 * fVar31 + fVar2 * fVar17 + fVar6 * fVar38;
            fVar129 = fVar143 * fVar25 + fVar129 + fVar132 * fVar32 + fVar2 * fVar18 +
                      fVar6 * fVar77;
            fVar131 = fVar143 * fVar26 + fVar131 + fVar132 * fVar33 + fVar2 * fVar19 +
                      fVar6 * fVar78;
            fVar133 = fVar143 * fVar27 + fVar133 + fVar132 * fVar34 + fVar2 * fVar20 +
                      fVar6 * fVar81;
            fVar135 = fVar143 * fVar28 + fVar135 + fVar132 * fVar35 + fVar2 * fVar21 +
                      fVar6 * fVar82;
            fVar137 = fVar1 + fVar137 + fVar132 + fVar113 + *(float *)((long)(ppp_Var48 + 0xf) + 4);
            pfVar59 = pfVar59 + 0x10;
            ppp_Var48 = ppp_Var48 + 0x10;
            iVar75 = iVar75 + 4;
            uVar40 = _h & 0xfffffffc;
          } while (iVar75 < (int)_h);
        }
        iVar75 = _h - uVar40;
        if (iVar75 != 0 && (int)uVar40 <= (int)_h) {
          lVar55 = 0;
          do {
            fVar1 = *(float *)((long)pfVar59 + lVar55);
            fVar140 = *(float *)((long)pfVar59 + lVar55 + 4);
            fVar142 = *(float *)((long)pfVar59 + lVar55 + 8);
            fVar143 = *(float *)((long)pfVar59 + lVar55 + 0xc);
            auVar86 = *(undefined1 (*) [32])((long)ppp_Var48 + lVar55 * 2);
            fVar124 = auVar86._0_4_;
            fVar128 = auVar86._4_4_;
            fVar130 = auVar86._8_4_;
            fVar132 = auVar86._12_4_;
            fVar134 = auVar86._16_4_;
            fVar136 = auVar86._20_4_;
            fVar138 = auVar86._24_4_;
            fVar88 = fVar124 * fVar1 + fVar88;
            fVar139 = fVar128 * fVar1 + fVar139;
            fVar89 = fVar130 * fVar1 + fVar89;
            fVar90 = fVar132 * fVar1 + fVar90;
            fVar91 = fVar134 * fVar1 + fVar91;
            fVar92 = fVar136 * fVar1 + fVar92;
            fVar93 = fVar138 * fVar1 + fVar93;
            fVar94 = fVar1 + fVar94;
            fVar96 = fVar124 * fVar140 + fVar96;
            fVar95 = fVar128 * fVar140 + fVar95;
            fVar98 = fVar130 * fVar140 + fVar98;
            fVar99 = fVar132 * fVar140 + fVar99;
            fVar100 = fVar134 * fVar140 + fVar100;
            fVar101 = fVar136 * fVar140 + fVar101;
            fVar102 = fVar138 * fVar140 + fVar102;
            fVar103 = fVar1 + fVar103;
            fVar105 = fVar124 * fVar142 + fVar105;
            fVar104 = fVar128 * fVar142 + fVar104;
            fVar106 = fVar130 * fVar142 + fVar106;
            fVar107 = fVar132 * fVar142 + fVar107;
            fVar108 = fVar134 * fVar142 + fVar108;
            fVar109 = fVar136 * fVar142 + fVar109;
            fVar110 = fVar138 * fVar142 + fVar110;
            fVar111 = fVar1 + fVar111;
            in_ZMM4 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar138 * fVar143,
                                                         CONCAT420(fVar136 * fVar143,
                                                                   CONCAT416(fVar134 * fVar143,
                                                                             CONCAT412(fVar132 * 
                                                  fVar143,CONCAT48(fVar130 * fVar143,
                                                                   CONCAT44(fVar128 * fVar143,
                                                                            fVar124 * fVar143)))))))
                              );
            fVar79 = fVar124 * fVar143 + fVar79;
            fVar112 = fVar128 * fVar143 + fVar112;
            fVar83 = fVar130 * fVar143 + fVar83;
            fVar129 = fVar132 * fVar143 + fVar129;
            fVar131 = fVar134 * fVar143 + fVar131;
            fVar133 = fVar136 * fVar143 + fVar133;
            fVar135 = fVar138 * fVar143 + fVar135;
            fVar137 = fVar1 + fVar137;
            lVar55 = lVar55 + 0x10;
            iVar75 = iVar75 + -1;
          } while (iVar75 != 0);
        }
        *pfVar73 = fVar88;
        pfVar73[1] = fVar139;
        pfVar73[2] = fVar89;
        pfVar73[3] = fVar90;
        pfVar73[4] = fVar91;
        pfVar73[5] = fVar92;
        pfVar73[6] = fVar93;
        pfVar73[7] = fVar94;
        *pfVar57 = fVar96;
        pfVar57[1] = fVar95;
        pfVar57[2] = fVar98;
        pfVar57[3] = fVar99;
        pfVar57[4] = fVar100;
        pfVar57[5] = fVar101;
        pfVar57[6] = fVar102;
        pfVar57[7] = fVar103;
        *pfVar70 = fVar105;
        pfVar70[1] = fVar104;
        pfVar70[2] = fVar106;
        pfVar70[3] = fVar107;
        pfVar70[4] = fVar108;
        pfVar70[5] = fVar109;
        pfVar70[6] = fVar110;
        pfVar70[7] = fVar111;
        *pfVar71 = fVar79;
        pfVar71[1] = fVar112;
        pfVar71[2] = fVar83;
        pfVar71[3] = fVar129;
        pfVar71[4] = fVar131;
        pfVar71[5] = fVar133;
        pfVar71[6] = fVar135;
        pfVar71[7] = fVar137;
        pfVar73 = pfVar73 + 8;
        pfVar57 = pfVar57 + 8;
        pfVar70 = pfVar70 + 8;
        pfVar71 = pfVar71 + 8;
        uVar53 = uVar76 + 8;
        lVar55 = uVar76 + 0xf;
        uVar76 = uVar53;
      } while (lVar55 < lVar47);
    }
    auVar85 = in_ZMM4._0_16_;
    local_108 = (ulong)uVar46;
    if ((int)uVar53 < (int)_w) {
      pfVar52 = (float *)((long)(int)uVar64 * kernel_tm->cstep * kernel_tm->elemsize +
                         (long)kernel_tm->data);
      do {
        ppp_Var48 = (_func_int ***)
                    ((long)(_func_int ***)local_158._0_8_ +
                    local_118 * local_158._16_8_ *
                    (ulong)(((uint)uVar53 & 7) + ((uint)(uVar53 >> 3) & 0x1fffffff)));
        fVar88 = 0.0;
        fVar96 = 0.0;
        fVar105 = 0.0;
        fVar79 = 0.0;
        pfVar59 = pfVar52;
        if ((int)_h < 4) {
          fVar98 = 0.0;
          fVar99 = 0.0;
          fVar100 = 0.0;
          fVar101 = 0.0;
          fVar92 = 0.0;
          fVar93 = 0.0;
          fVar94 = 0.0;
          fVar95 = 0.0;
          fVar139 = 0.0;
          fVar89 = 0.0;
          fVar90 = 0.0;
          fVar91 = 0.0;
          uVar64 = 0;
        }
        else {
          fVar139 = 0.0;
          fVar89 = 0.0;
          fVar90 = 0.0;
          fVar91 = 0.0;
          iVar75 = 3;
          fVar92 = 0.0;
          fVar93 = 0.0;
          fVar94 = 0.0;
          fVar95 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          fVar100 = 0.0;
          fVar101 = 0.0;
          do {
            fVar102 = *(float *)ppp_Var48;
            fVar103 = *(float *)((long)ppp_Var48 + 4);
            fVar104 = *(float *)(ppp_Var48 + 1);
            fVar106 = *(float *)((long)(ppp_Var48 + 1) + 4);
            fVar88 = fVar102 * *pfVar59 + fVar88;
            fVar96 = fVar102 * pfVar59[1] + fVar96;
            fVar105 = fVar102 * pfVar59[2] + fVar105;
            fVar79 = fVar102 * pfVar59[3] + fVar79;
            fVar98 = fVar103 * pfVar59[4] + fVar98;
            fVar99 = fVar103 * pfVar59[5] + fVar99;
            fVar100 = fVar103 * pfVar59[6] + fVar100;
            fVar101 = fVar103 * pfVar59[7] + fVar101;
            fVar92 = fVar104 * pfVar59[8] + fVar92;
            fVar93 = fVar104 * pfVar59[9] + fVar93;
            fVar94 = fVar104 * pfVar59[10] + fVar94;
            fVar95 = fVar104 * pfVar59[0xb] + fVar95;
            in_ZMM4 = ZEXT1664(CONCAT412(fVar106 * pfVar59[0xf],
                                         CONCAT48(fVar106 * pfVar59[0xe],
                                                  CONCAT44(fVar106 * pfVar59[0xd],
                                                           fVar106 * pfVar59[0xc]))));
            fVar139 = fVar106 * pfVar59[0xc] + fVar139;
            fVar89 = fVar106 * pfVar59[0xd] + fVar89;
            fVar90 = fVar106 * pfVar59[0xe] + fVar90;
            fVar91 = fVar106 * pfVar59[0xf] + fVar91;
            pfVar59 = pfVar59 + 0x10;
            ppp_Var48 = ppp_Var48 + 2;
            iVar75 = iVar75 + 4;
            uVar64 = _h & 0xfffffffc;
          } while (iVar75 < (int)_h);
        }
        auVar85 = in_ZMM4._0_16_;
        auVar80._0_4_ = fVar88 + fVar98 + fVar92 + fVar139 + *pfVar50;
        auVar80._4_4_ = fVar96 + fVar99 + fVar93 + fVar89 + pfVar50[1];
        auVar80._8_4_ = fVar105 + fVar100 + fVar94 + fVar90 + pfVar50[2];
        auVar80._12_4_ = fVar79 + fVar101 + fVar95 + fVar91 + pfVar50[3];
        if ((int)uVar64 < (int)_h) {
          lVar55 = 0;
          auVar97 = auVar80;
          do {
            fVar88 = *(float *)((long)ppp_Var48 + lVar55 * 4);
            auVar80._0_4_ = fVar88 * *pfVar59 + auVar97._0_4_;
            auVar80._4_4_ = fVar88 * pfVar59[1] + auVar97._4_4_;
            auVar80._8_4_ = fVar88 * pfVar59[2] + auVar97._8_4_;
            auVar80._12_4_ = fVar88 * pfVar59[3] + auVar97._12_4_;
            pfVar59 = pfVar59 + 4;
            lVar55 = lVar55 + 1;
            auVar97 = auVar80;
          } while (_h - uVar64 != (int)lVar55);
        }
        *pfVar73 = auVar80._0_4_;
        fVar88 = (float)vextractps_avx(auVar80,1);
        *pfVar57 = fVar88;
        fVar88 = (float)vextractps_avx(auVar80,2);
        *pfVar70 = fVar88;
        fVar88 = (float)vextractps_avx(auVar80,3);
        *pfVar71 = fVar88;
        pfVar73 = pfVar73 + 1;
        pfVar57 = pfVar57 + 1;
        pfVar70 = pfVar70 + 1;
        pfVar71 = pfVar71 + 1;
        uVar64 = (uint)uVar53 + 1;
        uVar53 = (ulong)uVar64;
      } while (uVar64 != _w);
    }
  }
  auVar116 = _DAT_00317280;
  auVar86 = _DAT_00317260;
  iVar75 = (int)uVar51 + uVar46 * 4;
  if (iVar75 < iVar10) {
    lVar55 = (long)iVar75;
    auVar97._8_8_ = 0x8000000000000000;
    auVar97._0_8_ = 0x8000000000000000;
    auVar85 = vpcmpeqd_avx(auVar85,auVar85);
    do {
      if (pvVar13 == (void *)0x0) {
        auVar80 = ZEXT816(0) << 0x40;
      }
      else {
        auVar80 = ZEXT416(*(uint *)((long)pvVar13 + lVar55 * 4));
      }
      pauVar43 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar55 * top_blob->elemsize + (long)top_blob->data);
      uVar51 = 0;
      uVar64 = (uint)lVar55;
      if (7 < (int)_w) {
        uVar40 = uVar64 + 3;
        uVar46 = uVar64 + 7;
        if (-1 < (int)uVar64) {
          uVar40 = uVar64;
          uVar46 = uVar64;
        }
        iVar63 = uVar64 - (uVar46 & 0xfffffff8);
        iVar75 = (uVar64 - (uVar46 & 0xfffffff8)) + 3;
        if (-1 < iVar63) {
          iVar75 = iVar63;
        }
        auVar114 = vshufps_avx(auVar80,auVar80,0);
        auVar117._16_16_ = auVar114;
        auVar117._0_16_ = auVar114;
        uVar53 = 0;
        do {
          ppp_Var48 = (_func_int ***)
                      ((long)(_func_int ***)local_158._0_8_ +
                      (uVar53 >> 3) * local_118 * local_158._16_8_);
          pfVar52 = (float *)(kernel_tm->cstep *
                              (long)(int)((uVar64 - (uVar40 & 0xfffffffc)) + ((int)uVar46 >> 3) +
                                         (iVar75 >> 2)) * kernel_tm->elemsize +
                             (long)kernel_tm->data);
          if ((int)_h < 4) {
            auVar127 = ZEXT3264(auVar117);
            uVar68 = 0;
          }
          else {
            iVar63 = 3;
            auVar127 = ZEXT3264(auVar117);
            do {
              fVar88 = *pfVar52;
              fVar96 = pfVar52[1];
              fVar105 = pfVar52[2];
              fVar79 = pfVar52[3];
              auVar127 = ZEXT3264(CONCAT428(fVar96 + fVar88 +
                                            fVar96 + fVar88 + fVar88 + auVar127._28_4_,
                                            CONCAT424(fVar79 * *(float *)(ppp_Var48 + 0xf) +
                                                      fVar96 * *(float *)(ppp_Var48 + 7) +
                                                      fVar105 * *(float *)(ppp_Var48 + 0xb) +
                                                      fVar88 * *(float *)(ppp_Var48 + 3) +
                                                      auVar127._24_4_,
                                                      CONCAT420(fVar79 * *(float *)((long)(ppp_Var48
                                                                                          + 0xe) + 4
                                                                                   ) +
                                                                fVar96 * *(float *)((long)(ppp_Var48
                                                                                          + 6) + 4)
                                                                + fVar105 * *(float *)((long)(
                                                  ppp_Var48 + 10) + 4) +
                                                  fVar88 * *(float *)((long)(ppp_Var48 + 2) + 4) +
                                                  auVar127._20_4_,
                                                  CONCAT416(fVar79 * *(float *)(ppp_Var48 + 0xe) +
                                                            fVar96 * *(float *)(ppp_Var48 + 6) +
                                                            fVar105 * *(float *)(ppp_Var48 + 10) +
                                                            fVar88 * *(float *)(ppp_Var48 + 2) +
                                                            auVar127._16_4_,
                                                            CONCAT412(fVar79 * *(float *)((long)(
                                                  ppp_Var48 + 0xd) + 4) +
                                                  fVar96 * *(float *)((long)(ppp_Var48 + 5) + 4) +
                                                  fVar105 * *(float *)((long)(ppp_Var48 + 9) + 4) +
                                                  fVar88 * *(float *)((long)(ppp_Var48 + 1) + 4) +
                                                  auVar127._12_4_,
                                                  CONCAT48(fVar79 * *(float *)(ppp_Var48 + 0xd) +
                                                           fVar96 * *(float *)(ppp_Var48 + 5) +
                                                           fVar105 * *(float *)(ppp_Var48 + 9) +
                                                           fVar88 * *(float *)(ppp_Var48 + 1) +
                                                           auVar127._8_4_,
                                                           CONCAT44(fVar79 * *(float *)((long)(
                                                  ppp_Var48 + 0xc) + 4) +
                                                  fVar96 * *(float *)((long)(ppp_Var48 + 4) + 4) +
                                                  fVar105 * *(float *)((long)(ppp_Var48 + 8) + 4) +
                                                  fVar88 * *(float *)((long)ppp_Var48 + 4) +
                                                  auVar127._4_4_,
                                                  fVar79 * *(float *)(ppp_Var48 + 0xc) +
                                                  fVar96 * *(float *)(ppp_Var48 + 4) +
                                                  fVar105 * *(float *)(ppp_Var48 + 8) +
                                                  fVar88 * *(float *)ppp_Var48 + auVar127._0_4_)))))
                                                  )));
              pfVar52 = pfVar52 + 4;
              ppp_Var48 = ppp_Var48 + 0x10;
              iVar63 = iVar63 + 4;
              uVar68 = _h & 0xfffffffc;
            } while (iVar63 < (int)_h);
          }
          auVar122 = auVar127._0_32_;
          if ((int)uVar68 < (int)_h) {
            lVar65 = 0;
            do {
              fVar88 = pfVar52[lVar65];
              auVar122._0_4_ = fVar88 * *(float *)ppp_Var48 + auVar127._0_4_;
              auVar122._4_4_ = fVar88 * *(float *)((long)ppp_Var48 + 4) + auVar127._4_4_;
              auVar122._8_4_ = fVar88 * *(float *)(ppp_Var48 + 1) + auVar127._8_4_;
              auVar122._12_4_ = fVar88 * *(float *)((long)(ppp_Var48 + 1) + 4) + auVar127._12_4_;
              auVar122._16_4_ = fVar88 * *(float *)(ppp_Var48 + 2) + auVar127._16_4_;
              auVar122._20_4_ = fVar88 * *(float *)((long)(ppp_Var48 + 2) + 4) + auVar127._20_4_;
              auVar122._24_4_ = fVar88 * *(float *)(ppp_Var48 + 3) + auVar127._24_4_;
              auVar122._28_4_ = fVar88 + auVar127._28_4_;
              auVar127 = ZEXT3264(auVar122);
              ppp_Var48 = ppp_Var48 + 4;
              lVar65 = lVar65 + 1;
            } while (_h - uVar68 != (int)lVar65);
          }
          *pauVar43 = auVar122;
          pauVar43 = pauVar43 + 1;
          uVar51 = uVar53 + 8;
          lVar65 = uVar53 + 0xf;
          uVar53 = uVar51;
        } while (lVar65 < lVar47);
      }
      if ((int)uVar51 < (int)_w) {
        uVar40 = uVar64 + 3;
        uVar46 = uVar64 + 7;
        if (-1 < (int)uVar64) {
          uVar40 = uVar64;
          uVar46 = uVar64;
        }
        iVar63 = uVar64 - (uVar46 & 0xfffffff8);
        iVar75 = (uVar64 - (uVar46 & 0xfffffff8)) + 3;
        if (-1 < iVar63) {
          iVar75 = iVar63;
        }
        pfVar52 = (float *)((long)(int)((uVar64 - (uVar40 & 0xfffffffc)) + ((int)uVar46 >> 3) +
                                       (iVar75 >> 2)) * kernel_tm->cstep * kernel_tm->elemsize +
                           (long)kernel_tm->data);
        do {
          ppp_Var48 = (_func_int ***)
                      ((long)(_func_int ***)local_158._0_8_ +
                      local_118 * local_158._16_8_ *
                      (ulong)(((uint)uVar51 & 7) + ((uint)(uVar51 >> 3) & 0x1fffffff)));
          pfVar50 = pfVar52;
          if ((int)_h < 4) {
            auVar114 = ZEXT816(0);
            uVar64 = 0;
          }
          else {
            iVar75 = 3;
            auVar120 = ZEXT816(0);
            do {
              auVar114._0_4_ = *pfVar50 * *(float *)ppp_Var48 + auVar120._0_4_;
              auVar114._4_4_ = pfVar50[1] * *(float *)((long)ppp_Var48 + 4) + auVar120._4_4_;
              auVar114._8_4_ = pfVar50[2] * *(float *)(ppp_Var48 + 1) + auVar120._8_4_;
              auVar114._12_4_ = pfVar50[3] * *(float *)((long)(ppp_Var48 + 1) + 4) + auVar120._12_4_
              ;
              pfVar50 = pfVar50 + 4;
              ppp_Var48 = ppp_Var48 + 2;
              iVar75 = iVar75 + 4;
              uVar64 = _h & 0xfffffffc;
              auVar120 = auVar114;
            } while (iVar75 < (int)_h);
          }
          auVar114 = vhaddps_avx(auVar114,auVar114);
          auVar114 = vhaddps_avx(auVar114,auVar114);
          fVar88 = auVar80._0_4_ + auVar114._0_4_;
          if ((int)uVar64 < (int)_h) {
            uVar53 = CONCAT44(0,~uVar64 + _h);
            auVar114 = vblendps_avx(ZEXT416((uint)fVar88),_DAT_00315030,0xe);
            auVar120._8_8_ = 0;
            auVar120._0_8_ = uVar53;
            auVar126 = vpshufd_avx(auVar120,0x44);
            auVar120 = vorps_avx(auVar126,auVar97);
            auVar125 = vorps_avx(auVar126,auVar97);
            uVar76 = 0;
            auVar127 = ZEXT1664(auVar114);
            do {
              auVar119 = auVar127;
              auVar141._8_8_ = 0;
              auVar141._0_8_ = uVar76;
              auVar114 = vpshufd_avx(auVar141,0x44);
              auVar144._16_16_ = auVar114;
              auVar144._0_16_ = auVar114;
              auVar121 = vorps_avx(auVar144,auVar86);
              auVar87 = vorps_avx(auVar144,auVar116);
              auVar114 = vorps_avx(auVar126,auVar97);
              auVar151._0_8_ = auVar87._16_8_ ^ 0x8000000000000000;
              auVar151._8_4_ = auVar87._24_4_;
              auVar151._12_4_ = auVar87._28_4_ ^ 0x80000000;
              auVar141 = vpcmpgtq_avx(auVar151,auVar114);
              auVar152._0_8_ = auVar87._0_8_ ^ 0x8000000000000000;
              auVar152._8_4_ = auVar87._8_4_;
              auVar152._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar115 = vpcmpgtq_avx(auVar152,auVar120);
              auVar115 = vpackssdw_avx(auVar115,auVar141);
              auVar153._0_8_ = auVar121._16_8_ ^ 0x8000000000000000;
              auVar153._8_4_ = auVar121._24_4_;
              auVar153._12_4_ = auVar121._28_4_ ^ 0x80000000;
              auVar151 = vpcmpgtq_avx(auVar153,auVar114);
              auVar154._0_8_ = auVar121._0_8_ ^ 0x8000000000000000;
              auVar154._8_4_ = auVar121._8_4_;
              auVar154._12_4_ = auVar121._12_4_ ^ 0x80000000;
              auVar114 = vpcmpgtq_avx(auVar154,auVar125);
              auVar114 = vpackssdw_avx(auVar114,auVar151);
              auVar114 = vpackssdw_avx(auVar114 ^ auVar85,auVar115 ^ auVar85);
              auVar115 = vpmovsxwd_avx(auVar114);
              auVar114 = vpunpckhwd_avx(auVar114,auVar114);
              auVar155._16_16_ = auVar114;
              auVar155._0_16_ = auVar115;
              auVar117 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])(pfVar50 + uVar76));
              auVar122 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                  ((long)ppp_Var48 + uVar76 * 4));
              auVar115._0_4_ = auVar119._0_4_ + auVar122._0_4_ * auVar117._0_4_;
              auVar115._4_4_ = auVar119._4_4_ + auVar122._4_4_ * auVar117._4_4_;
              auVar115._8_4_ = auVar119._8_4_ + auVar122._8_4_ * auVar117._8_4_;
              auVar115._12_4_ = auVar119._12_4_ + auVar122._12_4_ * auVar117._12_4_;
              auVar118._16_4_ = auVar119._16_4_ + auVar122._16_4_ * auVar117._16_4_;
              auVar118._0_16_ = auVar115;
              auVar118._20_4_ = auVar119._20_4_ + auVar122._20_4_ * auVar117._20_4_;
              auVar118._24_4_ = auVar119._24_4_ + auVar122._24_4_ * auVar117._24_4_;
              auVar118._28_4_ = auVar119._28_4_ + auVar117._28_4_;
              uVar76 = uVar76 + 8;
              auVar127 = ZEXT3264(auVar118);
            } while ((uVar53 + 8 & 0xfffffffffffffff8) != uVar76);
            auVar114 = vorps_avx(auVar126,auVar97);
            auVar125._0_8_ = auVar87._0_8_ ^ 0x8000000000000000;
            auVar125._8_4_ = auVar87._8_4_;
            auVar125._12_4_ = auVar87._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar125,auVar114);
            auVar120 = vpackssdw_avx(auVar114,auVar141);
            auVar114 = vorps_avx(auVar126,auVar97);
            auVar126._8_4_ = auVar121._8_4_;
            auVar126._0_8_ = auVar121._0_8_ ^ 0x8000000000000000;
            auVar126._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar114 = vpcmpgtq_avx(auVar126,auVar114);
            auVar114 = vpackssdw_avx(auVar114,auVar151);
            auVar114 = vblendvps_avx(auVar119._0_16_,auVar115,auVar114 ^ auVar85);
            auVar120 = vblendvps_avx(auVar119._16_16_,auVar118._16_16_,auVar120 ^ auVar85);
            auVar114 = vhaddps_avx(auVar120,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            auVar114 = vhaddps_avx(auVar114,auVar114);
            fVar88 = auVar114._0_4_;
          }
          *(float *)*pauVar43 = fVar88;
          pauVar43 = (undefined1 (*) [32])((long)*pauVar43 + 4);
          uVar64 = (uint)uVar51 + 1;
          uVar51 = (ulong)uVar64;
        } while (uVar64 != _w);
      }
      lVar55 = lVar55 + 1;
    } while (lVar55 < (long)uVar42);
  }
  piVar39 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_158._0_8_ != (Allocator *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  piVar39 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if ((Allocator *)local_a8._0_8_ != (Allocator *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*local_88->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias,
                                  const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw * outh, kernel_h * kernel_w * inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h * kernel_w * outw * outh;
        float* ret = (float*)bottom_im2col;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            for (int q = 0; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }

    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb + 4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb + 8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb + 12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0)); // sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1)); // sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2)); // sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3)); // sum3 = (a00-a03) * k30

                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};

                int k = 0;
                for (; k + 7 < L; k = k + 8)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 4];
                        sum1[n] += va[1] * vb[n + 4];
                        sum2[n] += va[2] * vb[n + 4];
                        sum3[n] += va[3] * vb[n + 4];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 8];
                        sum1[n] += va[1] * vb[n + 8];
                        sum2[n] += va[2] * vb[n + 8];
                        sum3[n] += va[3] * vb[n + 8];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 12];
                        sum1[n] += va[1] * vb[n + 12];
                        sum2[n] += va[2] * vb[n + 12];
                        sum3[n] += va[3] * vb[n + 12];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 16];
                        sum1[n] += va[1] * vb[n + 16];
                        sum2[n] += va[2] * vb[n + 16];
                        sum3[n] += va[3] * vb[n + 16];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 20];
                        sum1[n] += va[1] * vb[n + 20];
                        sum2[n] += va[2] * vb[n + 20];
                        sum3[n] += va[3] * vb[n + 20];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 24];
                        sum1[n] += va[1] * vb[n + 24];
                        sum2[n] += va[2] * vb[n + 24];
                        sum3[n] += va[3] * vb[n + 24];
                        va += 4;

                        sum0[n] += va[0] * vb[n + 28];
                        sum1[n] += va[1] * vb[n + 28];
                        sum2[n] += va[2] * vb[n + 28];
                        sum3[n] += va[3] * vb[n + 28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va + 4);
                    __m128 _va2 = _mm_loadu_ps(va + 8);
                    __m128 _va3 = _mm_loadu_ps(va + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0)); // sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1)); // sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2)); // sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3)); // sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k < L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va);

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0)); // sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }

                float sum0_3_tmp[4];
                _mm_storeu_ps(sum0_3_tmp, _sum0_3);
                output0[0] = sum0_3_tmp[0];
                output1[0] = sum0_3_tmp[1];
                output2[0] = sum0_3_tmp[2];
                output3[0] = sum0_3_tmp[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k = 0; k < L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                const float* vb = bottom_tm.channel(j / 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb + 4);
                    __m128 _vb2 = _mm_loadu_ps(vb + 8);
                    __m128 _vb3 = _mm_loadu_ps(vb + 12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1)); // sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2)); // sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3)); // sum0 += (a30-a33) * k03

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0)); // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0);
#else
                float sum[4] = {0};

                int k = 0;
                for (; k + 3 < L; k = k + 4)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n + 4];
                        sum[n] += va[2] * vb[n + 8];
                        sum[n] += va[3] * vb[n + 12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k < L; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j < N; j++)
            {
                const float* vb = bottom_tm.channel(j / 4 + j % 4);
                const float* va = kernel_tm.channel(i / 4 + i % 4);

                int k = 0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k + 3 < L; k += 4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;
                }
                float sum0_tmp[4];
                _mm_storeu_ps(sum0_tmp, _sum0);
                float sum0 = bias0 + sum0_tmp[0] + sum0_tmp[1] + sum0_tmp[2] + sum0_tmp[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k < L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }
}